

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

NaReal __thiscall NaVector::median(NaVector *this)

{
  int iVar1;
  uint uVar2;
  NaReal extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  NaVector rVect;
  NaReal local_38;
  NaVector local_30;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  if (iVar1 == 0) {
    local_38 = 0.0;
  }
  else {
    NaVector(&local_30,this);
    uVar2 = (*local_30._vptr_NaVector[6])(&local_30);
    qsort(local_30.pVect,(ulong)uVar2,8,compare_NaReals);
    if ((local_30.nDim & 0x80000001) == 1) {
      (*local_30._vptr_NaVector[9])(&local_30,(ulong)(local_30.nDim - 1 >> 1));
      local_38 = extraout_XMM0_Qa;
    }
    else {
      (*local_30._vptr_NaVector[9])(&local_30,(ulong)((int)local_30.nDim / 2 - 1));
      (*local_30._vptr_NaVector[9])(&local_30,(ulong)(uint)((int)local_30.nDim / 2));
      local_38 = (extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01) * 0.5;
    }
    ~NaVector(&local_30);
  }
  return local_38;
}

Assistant:

NaReal
NaVector::median () const
{
  if(0 == dim())
    return 0.0;

  NaVector	rVect(*this);
  int		N = rVect.dim();

  rVect.sort();

  if(1 == N % 2){
    return rVect((N - 1) / 2);
  }else{
    return (rVect((N / 2) - 1) +
	    rVect((N / 2))) / 2;
  }
}